

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,CombinationalStmtBlock *stmt)

{
  add_info(this,(Stmt *)stmt);
  return;
}

Assistant:

void inline visit(CombinationalStmtBlock *stmt) override { add_info(stmt); }